

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::MatrixAccumulator::clear(MatrixAccumulator *this)

{
  (this->super_BaseAccumulator).Count_ = 0;
  RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->Avg_,0.0);
  RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->Avg2_,0.0);
  RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->Val_,0.0);
  RectMatrix<double,_3U,_3U>::mul((RectMatrix<double,_3U,_3U> *)&this->Total_,0.0);
  return;
}

Assistant:

void clear() {
      Count_ = 0;
      Avg_ *= 0.0;
      Avg2_ *= 0.0;
      Val_ *= 0.0;
      Total_ *= 0.0;
    }